

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O0

_Bool ssh2_mac_verresult(ssh2_mac *mac,void *candidate)

{
  uint uVar1;
  uchar local_58 [7];
  _Bool toret;
  uchar correct [64];
  void *candidate_local;
  ssh2_mac *mac_local;
  
  correct._56_8_ = candidate;
  if ((uint)mac->vt->len < 0x41) {
    ssh2_mac_genresult(mac,local_58);
    uVar1 = smemeq(local_58,(void *)correct._56_8_,(long)mac->vt->len);
    smemclr(local_58,0x40);
    return uVar1 != 0;
  }
  __assert_fail("mac->vt->len <= sizeof(correct)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mac.c",0xf
                ,"_Bool ssh2_mac_verresult(ssh2_mac *, const void *)");
}

Assistant:

bool ssh2_mac_verresult(ssh2_mac *mac, const void *candidate)
{
    unsigned char correct[64]; /* at least as big as all known MACs */
    bool toret;

    assert(mac->vt->len <= sizeof(correct));
    ssh2_mac_genresult(mac, correct);
    toret = smemeq(correct, candidate, mac->vt->len);

    smemclr(correct, sizeof(correct));

    return toret;
}